

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

char * deqp::gls::(anonymous_namespace)::RandomArrayGenerator::
       createBasicArray<short,deqp::gls::(anonymous_namespace)::GLValue::WrappedType<short>>
                 (int seed,int elementCount,int componentCount,int offset,int stride)

{
  Short min_00;
  Short SVar1;
  short val;
  char *pcVar2;
  GLValue GVar3;
  bool local_b5;
  int local_b4;
  int local_b0;
  int componentNdx_2;
  int componentNdx_1;
  WrappedType<short> local_a4;
  short local_a2;
  WrappedType<short> local_a0;
  short local_9e;
  short local_9c;
  short local_9a;
  int local_98;
  WrappedType<short> local_94 [2];
  int componentNdx;
  WrappedType<short> components [4];
  int vertexNdx;
  deRandom rnd;
  WrappedType<short> previousComponents [4];
  char *writePtr;
  char *data;
  size_t bufferSize;
  size_t elementSize;
  size_t componentSize;
  anon_union_8_10_1f5805e9_for_GLValue_1 local_40;
  Short local_32;
  undefined1 local_30 [6];
  WrappedType<short> max;
  WrappedType<short> min;
  int stride_local;
  int offset_local;
  int componentCount_local;
  int elementCount_local;
  int seed_local;
  
  GVar3 = anon_unknown_1::GLValue::getMinValue(INPUTTYPE_SHORT);
  local_30._0_4_ = GVar3.type;
  min_00 = extractGLValue<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<short>>
                     ((GLValue *)local_30);
  GVar3 = anon_unknown_1::GLValue::getMaxValue(INPUTTYPE_SHORT);
  local_40 = GVar3.field_1;
  componentSize._0_4_ = GVar3.type;
  local_32 = extractGLValue<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<short>>
                       ((GLValue *)&componentSize);
  pcVar2 = (char *)operator_new__((long)(offset + (elementCount + -1) * stride) +
                                  (long)componentCount * 2);
  previousComponents = (WrappedType<short>  [4])((long)pcVar2 + (long)offset);
  deRandom_init((deRandom *)(components + 2),seed);
  components[0].m_value = 0;
  components[1].m_value = 0;
  for (; (int)components._0_4_ < elementCount; components._0_4_ = components._0_4_ + 1) {
    for (local_98 = 0; local_98 < componentCount; local_98 = local_98 + 1) {
      local_9e = local_32.m_value;
      local_9c = min_00.m_value;
      local_9a = (short)getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<short>>
                                  ((deRandom *)(components + 2),min_00,local_32);
      local_94[local_98].m_value = local_9a;
      local_b5 = false;
      if (components._0_4_ != 0) {
        local_a2 = (short)anon_unknown_1::GLValue::WrappedType<short>::operator-
                                    (local_94 + local_98,previousComponents + (long)local_98 + -4);
        local_a0.m_value =
             (short)abs<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<short>>
                              ((Short)local_a2);
        local_a4.m_value =
             (short)minValue<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<short>>();
        local_b5 = anon_unknown_1::GLValue::WrappedType<short>::operator<(&local_a0,&local_a4);
      }
      if (local_b5 != false) {
        SVar1 = getRandom<deqp::gls::(anonymous_namespace)::GLValue::WrappedType<short>>
                          ((deRandom *)(components + 2),min_00,local_32);
        local_94[local_98].m_value = SVar1.m_value;
      }
    }
    for (local_b0 = 0; local_b0 < componentCount; local_b0 = local_b0 + 1) {
      previousComponents[(long)local_b0 + -4].m_value = local_94[local_b0].m_value;
    }
    for (local_b4 = 0; local_b4 < componentCount; local_b4 = local_b4 + 1) {
      val = anon_unknown_1::GLValue::WrappedType<short>::getValue(local_94 + local_b4);
      anon_unknown_1::alignmentSafeAssignment<short>
                ((char *)((long)previousComponents + (long)local_b4 * 2),val);
    }
    previousComponents = (WrappedType<short>  [4])((long)previousComponents + (long)stride);
  }
  return pcVar2;
}

Assistant:

char* RandomArrayGenerator::createBasicArray (int seed, int elementCount, int componentCount, int offset, int stride)
{
	DE_ASSERT(componentCount >= 1 && componentCount <= 4);

	const GLType min = extractGLValue<GLType>(GLValue::getMinValue(GLValueTypeTraits<GLType>::Type));
	const GLType max = extractGLValue<GLType>(GLValue::getMaxValue(GLValueTypeTraits<GLType>::Type));

	const size_t componentSize	= sizeof(T);
	const size_t elementSize	= componentSize * componentCount;
	const size_t bufferSize		= offset + (elementCount - 1) * stride + elementSize;

	char* data = new char[bufferSize];
	char* writePtr = data + offset;

	GLType previousComponents[4];

	deRandom rnd;
	deRandom_init(&rnd, seed);

	for (int vertexNdx = 0; vertexNdx < elementCount; vertexNdx++)
	{
		GLType components[4];

		for (int componentNdx = 0; componentNdx < componentCount; componentNdx++)
		{
			components[componentNdx] = getRandom<GLType>(rnd, min, max);

			// Try to not create vertex near previous
			if (vertexNdx != 0 && abs(components[componentNdx] - previousComponents[componentNdx]) < minValue<GLType>())
			{
				// Too close, try again (but only once)
				components[componentNdx] = getRandom<GLType>(rnd, min, max);
			}
		}

		for (int componentNdx = 0; componentNdx < componentCount; componentNdx++)
			previousComponents[componentNdx] = components[componentNdx];

		for (int componentNdx = 0; componentNdx < componentCount; componentNdx++)
			alignmentSafeAssignment(writePtr + componentNdx*componentSize, components[componentNdx].getValue());

		writePtr += stride;
	}

	return data;
}